

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLAttribute::ParseDeep(XMLAttribute *this,char *p,bool processEntities)

{
  char cVar1;
  undefined8 in_RAX;
  char *pcVar2;
  char endTag [2];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  pcVar2 = StrPair::ParseName(&this->_name,p);
  if (((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) &&
     (pcVar2 = XMLUtil::SkipWhiteSpace(pcVar2), *pcVar2 == '=')) {
    pcVar2 = XMLUtil::SkipWhiteSpace(pcVar2 + 1);
    cVar1 = *pcVar2;
    if ((cVar1 == '\'') || (cVar1 == '\"')) {
      uStack_18 = (ulong)CONCAT16(cVar1,(undefined6)uStack_18);
      pcVar2 = StrPair::ParseText(&this->_value,pcVar2 + 1,(char *)((long)&uStack_18 + 6),
                                  processEntities | 2);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char* XMLAttribute::ParseDeep( char* p, bool processEntities )
{
    // Parse using the name rules: bug fix, was using ParseText before
    p = _name.ParseName( p );
    if ( !p || !*p ) {
        return 0;
    }

    // Skip white space before =
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '=' ) {
        return 0;
    }

    ++p;	// move up to opening quote
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '\"' && *p != '\'' ) {
        return 0;
    }

    char endTag[2] = { *p, 0 };
    ++p;	// move past opening quote

    p = _value.ParseText( p, endTag, processEntities ? StrPair::ATTRIBUTE_VALUE : StrPair::ATTRIBUTE_VALUE_LEAVE_ENTITIES );
    return p;
}